

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::FindShortestUpperAround(sector_t *this)

{
  FTexture *pFVar1;
  int i;
  long lVar2;
  double minsize;
  double local_20;
  
  local_20 = 3.4028234663852886e+38;
  for (lVar2 = 0; lVar2 < this->linecount; lVar2 = lVar2 + 1) {
    if ((this->lines[lVar2]->flags & 4) != 0) {
      CheckShortestTex((FTextureID)this->lines[lVar2]->sidedef[0]->textures[0].texture.texnum,
                       &local_20);
      CheckShortestTex((FTextureID)this->lines[lVar2]->sidedef[1]->textures[0].texture.texnum,
                       &local_20);
    }
  }
  if (3.4028234663852886e+38 <= local_20) {
    pFVar1 = FTextureManager::operator[](&TexMan,(char *)0x0);
    local_20 = (double)pFVar1->Height;
  }
  return local_20;
}

Assistant:

double sector_t::FindShortestUpperAround () const
{
	double minsize = FLT_MAX;

	for (int i = 0; i < linecount; i++)
	{
		if (lines[i]->flags & ML_TWOSIDED)
		{
			CheckShortestTex (lines[i]->sidedef[0]->GetTexture(side_t::top), minsize);
			CheckShortestTex (lines[i]->sidedef[1]->GetTexture(side_t::top), minsize);
		}
	}
	return minsize < FLT_MAX ? minsize : TexMan[0]->GetHeight();
}